

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

bool tinyexr::ReadAttribute
               (string *name,string *type,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *data,size_t *marker_size,
               char *marker,size_t size)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  reference __dest;
  char *__string;
  ulong __new_size;
  size_t __maxlen;
  ulong uVar4;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  sVar2 = strnlen(marker,size);
  if (sVar2 != size) {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,marker,marker + sVar2);
    std::__cxx11::string::operator=((string *)name,(string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
    __string = marker + sVar2 + 1;
    __maxlen = size - (sVar2 + 1);
    sVar3 = strnlen(__string,__maxlen);
    if (sVar3 != __maxlen) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,__string,__string + sVar3);
      std::__cxx11::string::operator=((string *)type,(string *)local_50);
      std::__cxx11::string::~string((string *)local_50);
      uVar4 = __maxlen - (sVar3 + 1);
      if (3 < uVar4) {
        __new_size = (ulong)*(uint *)(__string + sVar3 + 1);
        if (__new_size == 0) {
          iVar1 = std::__cxx11::string::compare((char *)type);
          if (iVar1 == 0) {
            *marker_size = sVar2 + sVar3 + 6;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(data,1);
            *(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start = '\0';
            return true;
          }
        }
        else if (__new_size <= uVar4 - 4) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(data,__new_size);
          __dest = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(data,0);
          memcpy(__dest,__string + sVar3 + 5,__new_size);
          *marker_size = __new_size + sVar2 + sVar3 + 6;
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

static bool ReadAttribute(std::string *name, std::string *type,
                          std::vector<unsigned char> *data, size_t *marker_size,
                          const char *marker, size_t size) {
  size_t name_len = strnlen(marker, size);
  if (name_len == size) {
    // String does not have a terminating character.
    return false;
  }
  *name = std::string(marker, name_len);

  marker += name_len + 1;
  size -= name_len + 1;

  size_t type_len = strnlen(marker, size);
  if (type_len == size) {
    return false;
  }
  *type = std::string(marker, type_len);

  marker += type_len + 1;
  size -= type_len + 1;

  if (size < sizeof(uint32_t)) {
    return false;
  }

  uint32_t data_len;
  memcpy(&data_len, marker, sizeof(uint32_t));
  tinyexr::swap4(reinterpret_cast<unsigned int *>(&data_len));

  if (data_len == 0) {
    if ((*type).compare("string") == 0) {
      // Accept empty string attribute.

      marker += sizeof(uint32_t);
      size -= sizeof(uint32_t);

      *marker_size = name_len + 1 + type_len + 1 + sizeof(uint32_t);

      data->resize(1);
      (*data)[0] = '\0';

      return true;
    } else {
      return false;
    }
  }

  marker += sizeof(uint32_t);
  size -= sizeof(uint32_t);

  if (size < data_len) {
    return false;
  }

  data->resize(static_cast<size_t>(data_len));
  memcpy(&data->at(0), marker, static_cast<size_t>(data_len));

  *marker_size = name_len + 1 + type_len + 1 + sizeof(uint32_t) + data_len;
  return true;
}